

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[5],pstack::ProgramHeaderName,char>
          (JObject *this,char (*k) [5],ProgramHeaderName *v,char *c)

{
  ostream *os;
  char (*local_40) [5];
  Field<char[5],_pstack::ProgramHeaderName> field;
  
  local_40 = k;
  field.k = (char (*) [5])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (ProgramHeaderName *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[5],_pstack::ProgramHeaderName>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }